

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O2

bool __thiscall
VulkanUtilities::VulkanInstance::IsExtensionEnabled(VulkanInstance *this,char *ExtensionName)

{
  pointer ppcVar1;
  pointer ppcVar2;
  int iVar3;
  pointer ppcVar4;
  char **Extension;
  
  ppcVar1 = (this->m_EnabledExtensions).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppcVar2 = (this->m_EnabledExtensions).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    ppcVar4 = ppcVar2;
    if (ppcVar4 == ppcVar1) break;
    iVar3 = strcmp(*ppcVar4,ExtensionName);
    ppcVar2 = ppcVar4 + 1;
  } while (iVar3 != 0);
  return ppcVar4 != ppcVar1;
}

Assistant:

bool VulkanInstance::IsExtensionEnabled(const char* ExtensionName) const
{
    for (const auto& Extension : m_EnabledExtensions)
        if (strcmp(Extension, ExtensionName) == 0)
            return true;

    return false;
}